

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
UA_Server_deleteReference
          (UA_Server *server,UA_NodeId sourceNodeId,UA_NodeId referenceTypeId,UA_Boolean isForward,
          UA_ExpandedNodeId targetNodeId,UA_Boolean deleteBidirectional)

{
  UA_StatusCode UVar1;
  undefined7 in_register_00000011;
  undefined1 auStack_78 [8];
  UA_DeleteReferencesItem item;
  
  item.sourceNodeId.identifier.string.length = (size_t)sourceNodeId.identifier.string.data;
  auStack_78._0_2_ = sourceNodeId.namespaceIndex;
  auStack_78._2_2_ = sourceNodeId._2_2_;
  auStack_78._4_4_ = sourceNodeId.identifierType;
  item.sourceNodeId.namespaceIndex = sourceNodeId.identifier._0_2_;
  item.sourceNodeId._2_2_ = sourceNodeId.identifier._2_2_;
  item.sourceNodeId.identifierType = sourceNodeId.identifier._4_4_;
  item.sourceNodeId.identifier.string.data = (UA_Byte *)referenceTypeId._0_8_;
  item.referenceTypeId.namespaceIndex = referenceTypeId.identifier._0_2_;
  item.referenceTypeId._2_2_ = referenceTypeId.identifier._2_2_;
  item.referenceTypeId.identifierType = referenceTypeId.identifier._4_4_;
  item.referenceTypeId.identifier.string.length = (size_t)referenceTypeId.identifier.string.data;
  item._48_8_ = targetNodeId.nodeId._0_8_;
  item.targetNodeId.nodeId.namespaceIndex = targetNodeId.nodeId.identifier._0_2_;
  item.targetNodeId.nodeId._2_2_ = targetNodeId.nodeId.identifier._2_2_;
  item.targetNodeId.nodeId.identifierType = targetNodeId.nodeId.identifier._4_4_;
  item.targetNodeId.nodeId.identifier.string.length =
       (size_t)targetNodeId.nodeId.identifier.string.data;
  item.targetNodeId.nodeId.identifier.string.data = (UA_Byte *)targetNodeId.namespaceUri.length;
  item.targetNodeId.namespaceUri.length = (size_t)targetNodeId.namespaceUri.data;
  item.targetNodeId.namespaceUri.data = (UA_Byte *)targetNodeId._40_8_;
  item.referenceTypeId.identifier.guid.data4[0] = isForward;
  item.targetNodeId.serverIndex._0_1_ = deleteBidirectional;
  UVar1 = deleteReference(server,(UA_Session *)auStack_78,
                          (UA_DeleteReferencesItem *)
                          CONCAT71(in_register_00000011,deleteBidirectional));
  return UVar1;
}

Assistant:

UA_StatusCode
UA_Server_deleteReference(UA_Server *server, const UA_NodeId sourceNodeId,
                          const UA_NodeId referenceTypeId,
                          UA_Boolean isForward, const UA_ExpandedNodeId targetNodeId,
                          UA_Boolean deleteBidirectional) {
    UA_DeleteReferencesItem item;
    item.sourceNodeId = sourceNodeId;
    item.referenceTypeId = referenceTypeId;
    item.isForward = isForward;
    item.targetNodeId = targetNodeId;
    item.deleteBidirectional = deleteBidirectional;
    UA_RCU_LOCK();
    UA_StatusCode retval = deleteReference(server, &adminSession, &item);
    UA_RCU_UNLOCK();
    return retval;
}